

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QPainterPath>::emplace<QPainterPath_const&>
          (QMovableArrayOps<QPainterPath> *this,qsizetype i,QPainterPath *args)

{
  QPainterPath **ppQVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter IStack_58;
  QPainterPath tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QPainterPath>).super_QArrayDataPointer<QPainterPath>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QPainterPath>).super_QArrayDataPointer<QPainterPath>.size == i
       ) {
      qVar5 = QArrayDataPointer<QPainterPath>::freeSpaceAtEnd
                        ((QArrayDataPointer<QPainterPath> *)this);
      if (qVar5 == 0) goto LAB_003a37e0;
      QPainterPath::QPainterPath
                ((this->super_QGenericArrayOps<QPainterPath>).super_QArrayDataPointer<QPainterPath>.
                 ptr + (this->super_QGenericArrayOps<QPainterPath>).
                       super_QArrayDataPointer<QPainterPath>.size,args);
LAB_003a38c5:
      pqVar2 = &(this->super_QGenericArrayOps<QPainterPath>).super_QArrayDataPointer<QPainterPath>.
                size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_003a3884;
    }
LAB_003a37e0:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QPainterPath>::freeSpaceAtBegin
                        ((QArrayDataPointer<QPainterPath> *)this);
      if (qVar5 != 0) {
        QPainterPath::QPainterPath
                  ((this->super_QGenericArrayOps<QPainterPath>).
                   super_QArrayDataPointer<QPainterPath>.ptr + -1,args);
        ppQVar1 = &(this->super_QGenericArrayOps<QPainterPath>).
                   super_QArrayDataPointer<QPainterPath>.ptr;
        *ppQVar1 = *ppQVar1 + -1;
        goto LAB_003a38c5;
      }
    }
  }
  tmp.d_ptr.d.ptr = (QExplicitlySharedDataPointer<QPainterPathPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QPainterPath::QPainterPath(&tmp,args);
  bVar6 = (this->super_QGenericArrayOps<QPainterPath>).super_QArrayDataPointer<QPainterPath>.size !=
          0;
  QArrayDataPointer<QPainterPath>::detachAndGrow
            ((QArrayDataPointer<QPainterPath> *)this,(uint)(i == 0 && bVar6),1,(QPainterPath **)0x0,
             (QArrayDataPointer<QPainterPath> *)0x0);
  if (i == 0 && bVar6) {
    QPainterPath::QPainterPath
              ((this->super_QGenericArrayOps<QPainterPath>).super_QArrayDataPointer<QPainterPath>.
               ptr + -1,&tmp);
    ppQVar1 = &(this->super_QGenericArrayOps<QPainterPath>).super_QArrayDataPointer<QPainterPath>.
               ptr;
    *ppQVar1 = *ppQVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QPainterPath>).super_QArrayDataPointer<QPainterPath>.
              size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&IStack_58,(QArrayDataPointer<QPainterPath> *)this,i,1);
    QPainterPath::QPainterPath(IStack_58.displaceFrom,&tmp);
    IStack_58.displaceFrom = IStack_58.displaceFrom + 1;
    Inserter::~Inserter(&IStack_58);
  }
  QPainterPath::~QPainterPath(&tmp);
LAB_003a3884:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }